

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeBase *
CreateGenericTypeInstance
          (ExpressionContext *ctx,SynBase *source,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> *types)

{
  ScopeData *target;
  _func_int **pp_Var1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  TypeClass **ppTVar5;
  ExprBase *node;
  size_t sVar6;
  char *pcVar7;
  ExprClassDefinition *pEVar8;
  char *pcVar9;
  ExprClassDefinition *definition;
  char *messageEnd;
  TypeBase *type;
  TypeHandle *curr;
  char *messageStart;
  char *errorCurr;
  uint traceDepth;
  bool prevErrorHandlerNested;
  jmp_buf prevErrorHandler;
  ExprBase *result;
  ScopeData *scope;
  TypeClass **prev;
  undefined1 local_40 [8];
  InplaceStr className;
  IntrusiveList<TypeHandle> *types_local;
  TypeGenericClassProto *proto_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  className.end = (char *)types;
  _local_40 = GetGenericClassTypeName(ctx,&proto->super_TypeBase,*types);
  uVar3 = InplaceStr::hash((InplaceStr *)local_40);
  ppTVar5 = HashMap<TypeClass_*>::find(&ctx->genericTypeMap,uVar3);
  if (ppTVar5 == (TypeClass **)0x0) {
    target = ctx->scope;
    ExpressionContext::SwitchToScopeAtPoint(ctx,proto->scope,proto->source);
    memcpy(&traceDepth,ctx->errorHandler,200);
    bVar2 = (bool)(ctx->errorHandlerNested & 1);
    ctx->errorHandlerNested = true;
    ctx->classInstanceDepth = ctx->classInstanceDepth + 1;
    if (0x40 < ctx->classInstanceDepth) {
      anon_unknown.dwarf_8df1c::Stop
                (ctx,source,"ERROR: reached maximum generic type instance depth (%d)",0x40);
    }
    uVar3 = NULLC::TraceGetDepth();
    iVar4 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
    if (iVar4 != 0) {
      NULLC::TraceLeaveTo(uVar3);
      ctx->classInstanceDepth = ctx->classInstanceDepth - 1;
      ExpressionContext::SwitchToScopeAtPoint(ctx,target,(SynBase *)0x0);
      if (ctx->errorBuf != (char *)0x0) {
        pcVar7 = ctx->errorBuf;
        sVar6 = strlen(ctx->errorBuf);
        pcVar7 = pcVar7 + sVar6;
        iVar4 = NULLC::SafeSprintf(pcVar7,(ulong)(ctx->errorBufSize -
                                                 ((int)pcVar7 - (int)ctx->errorBuf)),
                                   "while instantiating generic type %.*s<",
                                   (ulong)(uint)((int)(proto->super_TypeBase).name.end -
                                                (int)(proto->super_TypeBase).name.begin),
                                   (proto->super_TypeBase).name.begin);
        messageStart = pcVar7 + iVar4;
        for (type = *(TypeBase **)className.end; type != (TypeBase *)0x0;
            type = *(TypeBase **)&type->typeID) {
          pp_Var1 = type->_vptr_TypeBase;
          pcVar9 = "";
          if (type != *(TypeBase **)className.end) {
            pcVar9 = ", ";
          }
          iVar4 = NULLC::SafeSprintf(messageStart,
                                     (ulong)(ctx->errorBufSize -
                                            ((int)messageStart - (int)ctx->errorBuf)),"%s%.*s",
                                     pcVar9,(ulong)(uint)((int)pp_Var1[3] - (int)pp_Var1[2]),
                                     pp_Var1[2]);
          messageStart = messageStart + iVar4;
        }
        iVar4 = NULLC::SafeSprintf(messageStart,
                                   (ulong)(ctx->errorBufSize -
                                          ((int)messageStart - (int)ctx->errorBuf)),">");
        anon_unknown.dwarf_8df1c::AddRelatedErrorInfoWithLocation
                  (ctx,source,pcVar7,messageStart + iVar4);
      }
      memcpy(ctx->errorHandler,&traceDepth,200);
      ctx->errorHandlerNested = bVar2;
      longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
    }
    node = AnalyzeClassDefinition
                     (ctx,proto->definition,proto,*(IntrusiveList<TypeHandle> *)className.end);
    ctx->classInstanceDepth = ctx->classInstanceDepth - 1;
    ExpressionContext::SwitchToScopeAtPoint(ctx,target,(SynBase *)0x0);
    memcpy(ctx->errorHandler,&traceDepth,200);
    ctx->errorHandlerNested = bVar2;
    pEVar8 = getType<ExprClassDefinition>(node);
    if (pEVar8 == (ExprClassDefinition *)0x0) {
      anon_unknown.dwarf_8df1c::Stop
                (ctx,source,"ERROR: type \'%.*s\' couldn\'t be instantiated",
                 (ulong)(uint)((int)(proto->super_TypeBase).name.end -
                              (int)(proto->super_TypeBase).name.begin),
                 (proto->super_TypeBase).name.begin);
      ctx_local = (ExpressionContext *)0x0;
    }
    else {
      IntrusiveList<ExprBase>::push_back(&proto->instances,node);
      ctx_local = (ExpressionContext *)pEVar8->classType;
    }
  }
  else {
    ctx_local = (ExpressionContext *)*ppTVar5;
  }
  return (TypeBase *)ctx_local;
}

Assistant:

TypeBase* CreateGenericTypeInstance(ExpressionContext &ctx, SynBase *source, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> &types)
{
	InplaceStr className = GetGenericClassTypeName(ctx, proto, types);

	// Check if type already exists
	if(TypeClass **prev = ctx.genericTypeMap.find(className.hash()))
		return *prev;

	// Switch to original type scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(proto->scope, proto->source);

	ExprBase *result = NULL;

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	ctx.classInstanceDepth++;

	if(ctx.classInstanceDepth > NULLC_MAX_GENERIC_INSTANCE_DEPTH)
		Stop(ctx, source, "ERROR: reached maximum generic type instance depth (%d)", NULLC_MAX_GENERIC_INSTANCE_DEPTH);

	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		result = AnalyzeClassDefinition(ctx, proto->definition, proto, types);
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		ctx.classInstanceDepth--;

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		// Additional error info
		if(ctx.errorBuf)
		{
			char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

			const char *messageStart = errorCurr;

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "while instantiating generic type %.*s<", FMT_ISTR(proto->name));

			for(TypeHandle *curr = types.head; curr; curr = curr->next)
			{
				TypeBase *type = curr->type;

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", curr != types.head ? ", " : "", FMT_ISTR(type->name));
			}

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ">");

			const char *messageEnd = errorCurr;

			AddRelatedErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
		}

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		longjmp(ctx.errorHandler, 1);
	}

	ctx.classInstanceDepth--;

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	if(ExprClassDefinition *definition = getType<ExprClassDefinition>(result))
	{
		proto->instances.push_back(result);

		return definition->classType;
	}

	Stop(ctx, source, "ERROR: type '%.*s' couldn't be instantiated", FMT_ISTR(proto->name));

	return NULL;
}